

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void cbtCollisionWorld::objectQuerySingleInternal
               (cbtConvexShape *castShape,cbtTransform *convexFromTrans,cbtTransform *convexToTrans,
               cbtCollisionObjectWrapper *colObjWrap,ConvexResultCallback *resultCallback,
               cbtScalar allowedPenetration)

{
  cbtScalar *pcVar1;
  float fVar2;
  cbtStaticPlaneShape *plane;
  cbtTransform *this;
  cbtCollisionObject *pcVar3;
  cbtDbvt *this_00;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  long lVar12;
  LocalConvexResult *this_01;
  int i;
  long lVar13;
  cbtScalar cVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  float fVar27;
  float fVar28;
  float fVar29;
  cbtVector3 cVar30;
  cbtVector3 boxMinLocal_1;
  cbtGjkEpaPenetrationDepthSolver gjkEpaPenetrationSolver;
  float fStack_338;
  float fStack_334;
  cbtVector3 boxMaxLocal_1;
  cbtContinuousConvexCollision convexCaster1;
  LocalConvexResult localConvexResult;
  cbtTransform worldTocollisionObject;
  cbtVector3 local_210;
  cbtScalar local_200 [2];
  cbtScalar acStack_1f8 [2];
  cbtScalar local_1f0;
  undefined8 local_1e8;
  cbtScalar local_1e0;
  undefined8 local_1dc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  cbtVoronoiSimplexSolver simplexSolver;
  undefined1 auVar21 [56];
  undefined1 auVar26 [56];
  
  auVar26 = in_ZMM1._8_56_;
  auVar21 = in_register_00001204._4_56_;
  plane = (cbtStaticPlaneShape *)colObjWrap->m_shape;
  this = colObjWrap->m_worldTransform;
  iVar11 = (plane->super_cbtConcaveShape).super_cbtCollisionShape.m_shapeType;
  if (iVar11 < 0x18) {
    worldTocollisionObject.m_basis.m_el[0].m_floats._0_8_ = &PTR_DebugDraw_01193fa8;
    local_1e8 = 0;
    local_1dc = 0x38d1b71700000020;
    local_1f0 = resultCallback->m_closestHitFraction;
    simplexSolver.m_equalVertexThreshold = 0.0001;
    simplexSolver.m_cachedBC.m_usedVertices._0_1_ = 0;
    gjkEpaPenetrationSolver.super_cbtConvexPenetrationDepthSolver.
    _vptr_cbtConvexPenetrationDepthSolver =
         (cbtConvexPenetrationDepthSolver)
         (cbtConvexPenetrationDepthSolver)&PTR__cbtConvexPenetrationDepthSolver_01197c88;
    local_1e0 = allowedPenetration;
    cbtContinuousConvexCollision::cbtContinuousConvexCollision
              (&convexCaster1,castShape,(cbtConvexShape *)plane,&simplexSolver,
               &gjkEpaPenetrationSolver.super_cbtConvexPenetrationDepthSolver);
    iVar11 = (*convexCaster1.super_cbtConvexCast._vptr_cbtConvexCast[2])
                       (&convexCaster1,convexFromTrans,convexToTrans,this,this,
                        &worldTocollisionObject);
    if ((char)iVar11 != '\0') {
      cVar14 = cbtVector3::length2(&local_210);
      if ((0.0001 < cVar14) && (local_1f0 < resultCallback->m_closestHitFraction)) {
        cbtVector3::normalize(&local_210);
        localConvexResult.m_hitCollisionObject = colObjWrap->m_collisionObject;
        localConvexResult.m_localShapeInfo = (LocalShapeInfo *)0x0;
        localConvexResult.m_hitNormalLocal.m_floats[0] = local_210.m_floats[0];
        localConvexResult.m_hitNormalLocal.m_floats[1] = local_210.m_floats[1];
        localConvexResult.m_hitNormalLocal.m_floats[2] = local_210.m_floats[2];
        localConvexResult.m_hitNormalLocal.m_floats[3] = local_210.m_floats[3];
        localConvexResult.m_hitPointLocal.m_floats[0] = local_200[0];
        localConvexResult.m_hitPointLocal.m_floats[1] = local_200[1];
        localConvexResult.m_hitPointLocal.m_floats[2] = acStack_1f8[0];
        localConvexResult.m_hitPointLocal.m_floats[3] = acStack_1f8[1];
        localConvexResult.m_hitFraction = local_1f0;
        (*resultCallback->_vptr_ConvexResultCallback[3])(resultCallback,&localConvexResult,1);
      }
    }
    this_01 = (LocalConvexResult *)&convexCaster1;
  }
  else {
    if (10 < iVar11 - 0x19U) {
      if (iVar11 != 0x25) {
        return;
      }
      CProfileSample::CProfileSample((CProfileSample *)&boxMaxLocal_1,"convexSweepCompound");
      cbtTransform::inverse(&worldTocollisionObject,this);
      cbtTransform::operator*
                ((cbtTransform *)&simplexSolver,&worldTocollisionObject,convexFromTrans);
      (*(castShape->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                (castShape,&simplexSolver,&localConvexResult,&convexCaster1);
      cbtTransform::inverse(&worldTocollisionObject,this);
      cbtTransform::operator*((cbtTransform *)&simplexSolver,&worldTocollisionObject,convexToTrans);
      (*(castShape->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                (castShape,&simplexSolver,&gjkEpaPenetrationSolver,&boxMinLocal_1);
      if (gjkEpaPenetrationSolver.super_cbtConvexPenetrationDepthSolver.
          _vptr_cbtConvexPenetrationDepthSolver._0_4_ < localConvexResult.m_hitCollisionObject._0_4_
         ) {
        localConvexResult.m_hitCollisionObject =
             (cbtCollisionObject *)
             CONCAT44(localConvexResult.m_hitCollisionObject._4_4_,
                      gjkEpaPenetrationSolver.super_cbtConvexPenetrationDepthSolver.
                      _vptr_cbtConvexPenetrationDepthSolver._0_4_);
      }
      if (gjkEpaPenetrationSolver.super_cbtConvexPenetrationDepthSolver.
          _vptr_cbtConvexPenetrationDepthSolver._4_4_ < localConvexResult.m_hitCollisionObject._4_4_
         ) {
        localConvexResult.m_hitCollisionObject =
             (cbtCollisionObject *)
             CONCAT44(gjkEpaPenetrationSolver.super_cbtConvexPenetrationDepthSolver.
                      _vptr_cbtConvexPenetrationDepthSolver._4_4_,
                      localConvexResult.m_hitCollisionObject._0_4_);
      }
      if (fStack_338 < localConvexResult.m_localShapeInfo._0_4_) {
        localConvexResult.m_localShapeInfo =
             (LocalShapeInfo *)CONCAT44(localConvexResult.m_localShapeInfo._4_4_,fStack_338);
      }
      if (fStack_334 < localConvexResult.m_localShapeInfo._4_4_) {
        localConvexResult.m_localShapeInfo =
             (LocalShapeInfo *)CONCAT44(fStack_334,localConvexResult.m_localShapeInfo._0_4_);
      }
      if (convexCaster1.super_cbtConvexCast._vptr_cbtConvexCast._0_4_ < boxMinLocal_1.m_floats[0]) {
        convexCaster1.super_cbtConvexCast._vptr_cbtConvexCast._0_4_ = boxMinLocal_1.m_floats[0];
      }
      if (convexCaster1.super_cbtConvexCast._vptr_cbtConvexCast._4_4_ < boxMinLocal_1.m_floats[1]) {
        convexCaster1.super_cbtConvexCast._vptr_cbtConvexCast._4_4_ = boxMinLocal_1.m_floats[1];
      }
      if (convexCaster1.m_simplexSolver._0_4_ < boxMinLocal_1.m_floats[2]) {
        convexCaster1.m_simplexSolver._0_4_ = boxMinLocal_1.m_floats[2];
      }
      if (convexCaster1.m_simplexSolver._4_4_ < boxMinLocal_1.m_floats[3]) {
        convexCaster1.m_simplexSolver._4_4_ = boxMinLocal_1.m_floats[3];
      }
      simplexSolver._0_8_ = &PTR__ICollide_01193f00;
      this_00 = *(cbtDbvt **)((plane->m_localScaling).m_floats + 3);
      simplexSolver.m_simplexVectorW[0].m_floats._4_8_ = colObjWrap;
      simplexSolver.m_simplexVectorW._12_8_ = castShape;
      simplexSolver.m_simplexVectorW[1].m_floats._4_8_ = convexFromTrans;
      simplexSolver.m_simplexVectorW._28_8_ = convexToTrans;
      simplexSolver.m_simplexVectorW[2].m_floats[1] = allowedPenetration;
      simplexSolver.m_simplexVectorW._44_8_ = plane;
      simplexSolver.m_simplexVectorW[3].m_floats._4_8_ = this;
      simplexSolver.m_simplexVectorW._60_8_ = resultCallback;
      if (this_00 == (cbtDbvt *)0x0) {
        lVar12 = 0x40;
        for (lVar13 = 0; lVar13 < (int)(plane->m_localAabbMin).m_floats[1]; lVar13 = lVar13 + 1) {
          lVar4 = *(long *)(plane->m_localAabbMax).m_floats;
          pcVar1 = (cbtScalar *)(lVar4 + -0x40 + lVar12);
          worldTocollisionObject.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)pcVar1;
          worldTocollisionObject.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)(pcVar1 + 2);
          pcVar1 = (cbtScalar *)(lVar4 + -0x30 + lVar12);
          worldTocollisionObject.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)pcVar1;
          worldTocollisionObject.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)(pcVar1 + 2);
          pcVar1 = (cbtScalar *)(lVar4 + -0x20 + lVar12);
          worldTocollisionObject.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)pcVar1;
          worldTocollisionObject.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)(pcVar1 + 2);
          pcVar1 = (cbtScalar *)(lVar4 + -0x10 + lVar12);
          worldTocollisionObject.m_origin.m_floats._0_8_ = *(undefined8 *)pcVar1;
          worldTocollisionObject.m_origin.m_floats._8_8_ = *(undefined8 *)(pcVar1 + 2);
          objectQuerySingleInternal::cbtCompoundLeafCallback::ProcessChild
                    ((cbtCompoundLeafCallback *)&simplexSolver,(int)lVar13,&worldTocollisionObject,
                     *(cbtCollisionShape **)(lVar4 + lVar12));
          lVar12 = lVar12 + 0x58;
        }
      }
      else {
        worldTocollisionObject.m_basis.m_el[0].m_floats._0_8_ =
             localConvexResult.m_hitCollisionObject;
        worldTocollisionObject.m_basis.m_el[0].m_floats._8_8_ = localConvexResult.m_localShapeInfo;
        worldTocollisionObject.m_basis.m_el[1].m_floats._0_8_ =
             convexCaster1.super_cbtConvexCast._vptr_cbtConvexCast;
        worldTocollisionObject.m_basis.m_el[1].m_floats._8_8_ = convexCaster1.m_simplexSolver;
        cbtDbvt::collideTV(this_00,this_00->m_root,(cbtDbvtVolume *)&worldTocollisionObject,
                           (ICollide *)&simplexSolver);
      }
      CProfileSample::~CProfileSample((CProfileSample *)&boxMaxLocal_1);
      return;
    }
    if (iVar11 != 0x22) {
      simplexSolver.m_simplexPointsQ[3].m_floats[1] = allowedPenetration;
      simplexSolver.m_simplexPointsQ._60_8_ = resultCallback;
      simplexSolver._240_8_ = plane;
      if (iVar11 == 0x19) {
        cbtTransform::inverse(&worldTocollisionObject,this);
        cVar30 = cbtTransform::operator()(&worldTocollisionObject,&convexFromTrans->m_origin);
        auVar22._0_8_ = cVar30.m_floats._8_8_;
        auVar22._8_56_ = auVar26;
        auVar17._0_8_ = cVar30.m_floats._0_8_;
        auVar17._8_56_ = auVar21;
        convexCaster1._0_16_ = vmovlhps_avx(auVar17._0_16_,auVar22._0_16_);
        auVar21 = ZEXT856(convexCaster1.m_simplexSolver);
        cVar30 = cbtTransform::operator()(&worldTocollisionObject,&convexToTrans->m_origin);
        auVar23._0_8_ = cVar30.m_floats._8_8_;
        auVar23._8_56_ = auVar26;
        auVar18._0_8_ = cVar30.m_floats._0_8_;
        auVar18._8_56_ = auVar21;
        _gjkEpaPenetrationSolver = (cbtScalar  [4])vmovlhps_avx(auVar18._0_16_,auVar23._0_16_);
        ::operator*((cbtMatrix3x3 *)&simplexSolver,&worldTocollisionObject.m_basis,
                    &convexToTrans->m_basis);
        localConvexResult.m_hitCollisionObject = (cbtCollisionObject *)simplexSolver._0_8_;
        localConvexResult.m_localShapeInfo =
             (LocalShapeInfo *)simplexSolver.m_simplexVectorW[0].m_floats._4_8_;
        localConvexResult.m_hitNormalLocal.m_floats[0] =
             simplexSolver.m_simplexVectorW[0].m_floats[3];
        localConvexResult.m_hitNormalLocal.m_floats[1] =
             simplexSolver.m_simplexVectorW[1].m_floats[0];
        localConvexResult.m_hitNormalLocal.m_floats[2] =
             simplexSolver.m_simplexVectorW[1].m_floats[1];
        localConvexResult.m_hitNormalLocal.m_floats[3] =
             simplexSolver.m_simplexVectorW[1].m_floats[2];
        localConvexResult.m_hitPointLocal.m_floats[0] =
             simplexSolver.m_simplexVectorW[1].m_floats[3];
        localConvexResult.m_hitPointLocal.m_floats[1] =
             simplexSolver.m_simplexVectorW[2].m_floats[0];
        register0x00001200 = ZEXT816(0) << 0x20;
        pcVar3 = colObjWrap->m_collisionObject;
        cVar14 = 0.0;
        (*(plane->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])
                  (plane);
        cbtTriangleConvexcastCallback::cbtTriangleConvexcastCallback
                  ((cbtTriangleConvexcastCallback *)&simplexSolver,castShape,convexFromTrans,
                   convexToTrans,this,cVar14);
        simplexSolver._0_8_ = &PTR__cbtTriangleCallback_01193e70;
        simplexSolver.m_simplexPointsQ[2].m_floats[3] = resultCallback->m_closestHitFraction;
        simplexSolver.m_simplexPointsQ[4].m_floats._4_8_ = pcVar3;
        (*(castShape->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                  (castShape,&localConvexResult,&boxMinLocal_1,&boxMaxLocal_1);
        cbtBvhTriangleMeshShape::performConvexcast
                  ((cbtBvhTriangleMeshShape *)plane,(cbtTriangleCallback *)&simplexSolver,
                   (cbtVector3 *)&convexCaster1,(cbtVector3 *)&gjkEpaPenetrationSolver,
                   &boxMinLocal_1,&boxMaxLocal_1);
      }
      else {
        cbtTransform::inverse(&worldTocollisionObject,this);
        cVar30 = cbtTransform::operator()(&worldTocollisionObject,&convexFromTrans->m_origin);
        auVar24._0_8_ = cVar30.m_floats._8_8_;
        auVar24._8_56_ = auVar26;
        auVar19._0_8_ = cVar30.m_floats._0_8_;
        auVar19._8_56_ = auVar21;
        local_1a8 = auVar19._0_16_;
        local_1b8 = auVar24._0_16_;
        cVar30 = cbtTransform::operator()(&worldTocollisionObject,&convexToTrans->m_origin);
        auVar25._0_8_ = cVar30.m_floats._8_8_;
        auVar25._8_56_ = auVar26;
        auVar20._0_8_ = cVar30.m_floats._0_8_;
        auVar20._8_56_ = auVar21;
        local_1c8 = auVar20._0_16_;
        ::operator*((cbtMatrix3x3 *)&simplexSolver,&worldTocollisionObject.m_basis,
                    &convexToTrans->m_basis);
        localConvexResult.m_hitCollisionObject = (cbtCollisionObject *)simplexSolver._0_8_;
        localConvexResult.m_localShapeInfo =
             (LocalShapeInfo *)simplexSolver.m_simplexVectorW[0].m_floats._4_8_;
        localConvexResult.m_hitNormalLocal.m_floats[0] =
             simplexSolver.m_simplexVectorW[0].m_floats[3];
        localConvexResult.m_hitNormalLocal.m_floats[1] =
             simplexSolver.m_simplexVectorW[1].m_floats[0];
        localConvexResult.m_hitNormalLocal.m_floats[2] =
             simplexSolver.m_simplexVectorW[1].m_floats[1];
        localConvexResult.m_hitNormalLocal.m_floats[3] =
             simplexSolver.m_simplexVectorW[1].m_floats[2];
        localConvexResult.m_hitPointLocal.m_floats[0] =
             simplexSolver.m_simplexVectorW[1].m_floats[3];
        localConvexResult.m_hitPointLocal.m_floats[1] =
             simplexSolver.m_simplexVectorW[2].m_floats[0];
        register0x00001200 = ZEXT816(0) << 0x20;
        pcVar3 = colObjWrap->m_collisionObject;
        cVar14 = 0.0;
        (*(plane->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])
                  (plane);
        cbtTriangleConvexcastCallback::cbtTriangleConvexcastCallback
                  ((cbtTriangleConvexcastCallback *)&simplexSolver,castShape,convexFromTrans,
                   convexToTrans,this,cVar14);
        simplexSolver._0_8_ = &PTR__cbtTriangleCallback_01193eb8;
        simplexSolver.m_simplexPointsQ[2].m_floats[3] = resultCallback->m_closestHitFraction;
        simplexSolver.m_simplexPointsQ[4].m_floats._4_8_ = pcVar3;
        (*(castShape->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                  (castShape,&localConvexResult,&convexCaster1,&gjkEpaPenetrationSolver);
        fVar2 = local_1b8._0_4_;
        auVar5 = vmovlhps_avx(local_1a8,local_1b8);
        auVar16 = local_1a8;
        if (local_1c8._0_4_ < local_1a8._0_4_) {
          auVar16 = local_1c8;
        }
        auVar15 = vmovshdup_avx(local_1a8);
        auVar6 = vmovshdup_avx(local_1c8);
        auVar7 = vmovshdup_avx(local_1b8);
        if (auVar6._0_4_ < auVar15._0_4_) {
          auVar15 = auVar6;
        }
        boxMinLocal_1.m_floats[3] = auVar5._12_4_;
        fVar29 = cVar30.m_floats[2];
        fVar27 = fVar2;
        if (fVar29 < fVar2) {
          fVar27 = fVar29;
        }
        auVar5 = vmovshdup_avx(auVar25._0_16_);
        fVar28 = auVar5._0_4_;
        if (fVar28 < auVar7._0_4_) {
          boxMinLocal_1.m_floats[3] = fVar28;
        }
        uVar8 = vcmpss_avx512f(local_1b8,auVar25._0_16_,1);
        bVar9 = (bool)((byte)uVar8 & 1);
        auVar5 = vmaxps_avx(local_1c8,local_1a8);
        uVar8 = vmovlps_avx(local_1b8);
        boxMaxLocal_1.m_floats[3] = (cbtScalar)((ulong)uVar8 >> 0x20);
        if (auVar7._0_4_ < fVar28) {
          boxMaxLocal_1.m_floats[3] = fVar28;
        }
        auVar16 = vinsertps_avx(auVar16,auVar15,0x10);
        auVar15._0_4_ = convexCaster1.super_cbtConvexCast._vptr_cbtConvexCast._0_4_ + auVar16._0_4_;
        auVar15._4_4_ = convexCaster1.super_cbtConvexCast._vptr_cbtConvexCast._4_4_ + auVar16._4_4_;
        auVar15._8_4_ = auVar16._8_4_ + 0.0;
        auVar15._12_4_ = auVar16._12_4_ + 0.0;
        uVar8 = vmovlps_avx(auVar15);
        boxMinLocal_1.m_floats[2] = fVar27 + convexCaster1.m_simplexSolver._0_4_;
        boxMinLocal_1.m_floats[0] = (cbtScalar)(int)uVar8;
        boxMinLocal_1.m_floats[1] = (cbtScalar)(int)((ulong)uVar8 >> 0x20);
        auVar16._0_4_ =
             gjkEpaPenetrationSolver.super_cbtConvexPenetrationDepthSolver.
             _vptr_cbtConvexPenetrationDepthSolver._0_4_ + auVar5._0_4_;
        auVar16._4_4_ =
             gjkEpaPenetrationSolver.super_cbtConvexPenetrationDepthSolver.
             _vptr_cbtConvexPenetrationDepthSolver._4_4_ + auVar5._4_4_;
        auVar16._8_4_ = auVar5._8_4_ + 0.0;
        auVar16._12_4_ = auVar5._12_4_ + 0.0;
        boxMaxLocal_1.m_floats._0_8_ = vmovlps_avx(auVar16);
        boxMaxLocal_1.m_floats[2] =
             (float)((uint)bVar9 * (int)fVar29 + (uint)!bVar9 * (int)fVar2) + fStack_338;
        (*(plane->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
                  (plane,&simplexSolver);
      }
      cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)&simplexSolver);
      return;
    }
    simplexSolver._0_8_ = &PTR_DebugDraw_01193fa8;
    simplexSolver.m_simplexPointsQ[0].m_floats[3] = 0.0;
    simplexSolver.m_simplexPointsQ[1].m_floats[0] = 0.0;
    simplexSolver.m_simplexPointsQ[1].m_floats[2] = 4.48416e-44;
    simplexSolver.m_simplexPointsQ[1].m_floats[3] = 0.0001;
    simplexSolver.m_simplexPointsQ[0].m_floats[1] = resultCallback->m_closestHitFraction;
    simplexSolver.m_simplexPointsQ[1].m_floats[1] = allowedPenetration;
    cbtContinuousConvexCollision::cbtContinuousConvexCollision
              ((cbtContinuousConvexCollision *)&localConvexResult,castShape,plane);
    cVar10 = (**(code **)(((localConvexResult.m_hitCollisionObject)->m_worldTransform).m_basis.m_el
                          [0].m_floats + 2))
                       (&localConvexResult,convexFromTrans,convexToTrans,this,this,&simplexSolver);
    if (cVar10 != '\0') {
      pcVar1 = simplexSolver.m_simplexPointsP[3].m_floats + 1;
      cVar14 = cbtVector3::length2((cbtVector3 *)pcVar1);
      if ((0.0001 < cVar14) &&
         (simplexSolver.m_simplexPointsQ[0].m_floats[1] < resultCallback->m_closestHitFraction)) {
        cbtVector3::normalize((cbtVector3 *)pcVar1);
        worldTocollisionObject.m_basis.m_el[0].m_floats._0_8_ = colObjWrap->m_collisionObject;
        worldTocollisionObject.m_basis.m_el[0].m_floats[2] = 0.0;
        worldTocollisionObject.m_basis.m_el[0].m_floats[3] = 0.0;
        worldTocollisionObject.m_basis.m_el[1].m_floats[0] =
             simplexSolver.m_simplexPointsP[3].m_floats[1];
        worldTocollisionObject.m_basis.m_el[1].m_floats[1] =
             simplexSolver.m_simplexPointsP[3].m_floats[2];
        worldTocollisionObject.m_basis.m_el[1].m_floats[2] =
             simplexSolver.m_simplexPointsP[3].m_floats[3];
        worldTocollisionObject.m_basis.m_el[1].m_floats[3] =
             simplexSolver.m_simplexPointsP[4].m_floats[0];
        worldTocollisionObject.m_basis.m_el[2].m_floats[0] =
             simplexSolver.m_simplexPointsP[4].m_floats[1];
        worldTocollisionObject.m_basis.m_el[2].m_floats[1] =
             simplexSolver.m_simplexPointsP[4].m_floats[2];
        worldTocollisionObject.m_basis.m_el[2].m_floats[2] =
             simplexSolver.m_simplexPointsP[4].m_floats[3];
        worldTocollisionObject.m_basis.m_el[2].m_floats[3] =
             simplexSolver.m_simplexPointsQ[0].m_floats[0];
        worldTocollisionObject.m_origin.m_floats[0] = simplexSolver.m_simplexPointsQ[0].m_floats[1];
        (*resultCallback->_vptr_ConvexResultCallback[3])(resultCallback,&worldTocollisionObject,1);
      }
    }
    this_01 = &localConvexResult;
  }
  cbtConvexCast::~cbtConvexCast((cbtConvexCast *)this_01);
  return;
}

Assistant:

void cbtCollisionWorld::objectQuerySingleInternal(const cbtConvexShape* castShape, const cbtTransform& convexFromTrans, const cbtTransform& convexToTrans,
												 const cbtCollisionObjectWrapper* colObjWrap,
												 ConvexResultCallback& resultCallback, cbtScalar allowedPenetration)
{
	const cbtCollisionShape* collisionShape = colObjWrap->getCollisionShape();
	const cbtTransform& colObjWorldTransform = colObjWrap->getWorldTransform();

	if (collisionShape->isConvex())
	{
		//BT_PROFILE("convexSweepConvex");
		cbtConvexCast::CastResult castResult;
		castResult.m_allowedPenetration = allowedPenetration;
		castResult.m_fraction = resultCallback.m_closestHitFraction;  //cbtScalar(1.);//??

		cbtConvexShape* convexShape = (cbtConvexShape*)collisionShape;
		cbtVoronoiSimplexSolver simplexSolver;
		cbtGjkEpaPenetrationDepthSolver gjkEpaPenetrationSolver;

		cbtContinuousConvexCollision convexCaster1(castShape, convexShape, &simplexSolver, &gjkEpaPenetrationSolver);
		//cbtGjkConvexCast convexCaster2(castShape,convexShape,&simplexSolver);
		//cbtSubsimplexConvexCast convexCaster3(castShape,convexShape,&simplexSolver);

		cbtConvexCast* castPtr = &convexCaster1;

		if (castPtr->calcTimeOfImpact(convexFromTrans, convexToTrans, colObjWorldTransform, colObjWorldTransform, castResult))
		{
			//add hit
			if (castResult.m_normal.length2() > cbtScalar(0.0001))
			{
				if (castResult.m_fraction < resultCallback.m_closestHitFraction)
				{
					castResult.m_normal.normalize();
					cbtCollisionWorld::LocalConvexResult localConvexResult(
						colObjWrap->getCollisionObject(),
						0,
						castResult.m_normal,
						castResult.m_hitPoint,
						castResult.m_fraction);

					bool normalInWorldSpace = true;
					resultCallback.addSingleResult(localConvexResult, normalInWorldSpace);
				}
			}
		}
	}
	else
	{
		if (collisionShape->isConcave())
		{
			if (collisionShape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				//BT_PROFILE("convexSweepcbtBvhTriangleMesh");
				cbtBvhTriangleMeshShape* triangleMesh = (cbtBvhTriangleMeshShape*)collisionShape;
				cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();
				cbtVector3 convexFromLocal = worldTocollisionObject * convexFromTrans.getOrigin();
				cbtVector3 convexToLocal = worldTocollisionObject * convexToTrans.getOrigin();
				// rotation of box in local mesh space = MeshRotation^-1 * ConvexToRotation
				cbtTransform rotationXform = cbtTransform(worldTocollisionObject.getBasis() * convexToTrans.getBasis());

				//ConvexCast::CastResult
				struct BridgeTriangleConvexcastCallback : public cbtTriangleConvexcastCallback
				{
					cbtCollisionWorld::ConvexResultCallback* m_resultCallback;
					const cbtCollisionObject* m_collisionObject;
					cbtTriangleMeshShape* m_triangleMesh;

					BridgeTriangleConvexcastCallback(const cbtConvexShape* castShape, const cbtTransform& from, const cbtTransform& to,
													 cbtCollisionWorld::ConvexResultCallback* resultCallback, const cbtCollisionObject* collisionObject, cbtTriangleMeshShape* triangleMesh, const cbtTransform& triangleToWorld) : cbtTriangleConvexcastCallback(castShape, from, to, triangleToWorld, triangleMesh->getMargin()),
																																																								m_resultCallback(resultCallback),
																																																								m_collisionObject(collisionObject),
																																																								m_triangleMesh(triangleMesh)
					{
					}

					virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, const cbtVector3& hitPointLocal, cbtScalar hitFraction, int partId, int triangleIndex)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = partId;
						shapeInfo.m_triangleIndex = triangleIndex;
						if (hitFraction <= m_resultCallback->m_closestHitFraction)
						{
							cbtCollisionWorld::LocalConvexResult convexResult(m_collisionObject,
																			 &shapeInfo,
																			 hitNormalLocal,
																			 hitPointLocal,
																			 hitFraction);

							bool normalInWorldSpace = true;

							return m_resultCallback->addSingleResult(convexResult, normalInWorldSpace);
						}
						return hitFraction;
					}
				};

				BridgeTriangleConvexcastCallback tccb(castShape, convexFromTrans, convexToTrans, &resultCallback, colObjWrap->getCollisionObject(), triangleMesh, colObjWorldTransform);
				tccb.m_hitFraction = resultCallback.m_closestHitFraction;
				tccb.m_allowedPenetration = allowedPenetration;
				cbtVector3 boxMinLocal, boxMaxLocal;
				castShape->getAabb(rotationXform, boxMinLocal, boxMaxLocal);
				triangleMesh->performConvexcast(&tccb, convexFromLocal, convexToLocal, boxMinLocal, boxMaxLocal);
			}
			else
			{
				if (collisionShape->getShapeType() == STATIC_PLANE_PROXYTYPE)
				{
					cbtConvexCast::CastResult castResult;
					castResult.m_allowedPenetration = allowedPenetration;
					castResult.m_fraction = resultCallback.m_closestHitFraction;
					cbtStaticPlaneShape* planeShape = (cbtStaticPlaneShape*)collisionShape;
					cbtContinuousConvexCollision convexCaster1(castShape, planeShape);
					cbtConvexCast* castPtr = &convexCaster1;

					if (castPtr->calcTimeOfImpact(convexFromTrans, convexToTrans, colObjWorldTransform, colObjWorldTransform, castResult))
					{
						//add hit
						if (castResult.m_normal.length2() > cbtScalar(0.0001))
						{
							if (castResult.m_fraction < resultCallback.m_closestHitFraction)
							{
								castResult.m_normal.normalize();
								cbtCollisionWorld::LocalConvexResult localConvexResult(
									colObjWrap->getCollisionObject(),
									0,
									castResult.m_normal,
									castResult.m_hitPoint,
									castResult.m_fraction);

								bool normalInWorldSpace = true;
								resultCallback.addSingleResult(localConvexResult, normalInWorldSpace);
							}
						}
					}
				}
				else
				{
					//BT_PROFILE("convexSweepConcave");
					cbtConcaveShape* concaveShape = (cbtConcaveShape*)collisionShape;
					cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();
					cbtVector3 convexFromLocal = worldTocollisionObject * convexFromTrans.getOrigin();
					cbtVector3 convexToLocal = worldTocollisionObject * convexToTrans.getOrigin();
					// rotation of box in local mesh space = MeshRotation^-1 * ConvexToRotation
					cbtTransform rotationXform = cbtTransform(worldTocollisionObject.getBasis() * convexToTrans.getBasis());

					//ConvexCast::CastResult
					struct BridgeTriangleConvexcastCallback : public cbtTriangleConvexcastCallback
					{
						cbtCollisionWorld::ConvexResultCallback* m_resultCallback;
						const cbtCollisionObject* m_collisionObject;
						cbtConcaveShape* m_triangleMesh;

						BridgeTriangleConvexcastCallback(const cbtConvexShape* castShape, const cbtTransform& from, const cbtTransform& to,
														 cbtCollisionWorld::ConvexResultCallback* resultCallback, const cbtCollisionObject* collisionObject, cbtConcaveShape* triangleMesh, const cbtTransform& triangleToWorld) : cbtTriangleConvexcastCallback(castShape, from, to, triangleToWorld, triangleMesh->getMargin()),
																																																							   m_resultCallback(resultCallback),
																																																							   m_collisionObject(collisionObject),
																																																							   m_triangleMesh(triangleMesh)
						{
						}

						virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, const cbtVector3& hitPointLocal, cbtScalar hitFraction, int partId, int triangleIndex)
						{
							cbtCollisionWorld::LocalShapeInfo shapeInfo;
							shapeInfo.m_shapePart = partId;
							shapeInfo.m_triangleIndex = triangleIndex;
							if (hitFraction <= m_resultCallback->m_closestHitFraction)
							{
								cbtCollisionWorld::LocalConvexResult convexResult(m_collisionObject,
																				 &shapeInfo,
																				 hitNormalLocal,
																				 hitPointLocal,
																				 hitFraction);

								bool normalInWorldSpace = true;

								return m_resultCallback->addSingleResult(convexResult, normalInWorldSpace);
							}
							return hitFraction;
						}
					};

					BridgeTriangleConvexcastCallback tccb(castShape, convexFromTrans, convexToTrans, &resultCallback, colObjWrap->getCollisionObject(), concaveShape, colObjWorldTransform);
					tccb.m_hitFraction = resultCallback.m_closestHitFraction;
					tccb.m_allowedPenetration = allowedPenetration;
					cbtVector3 boxMinLocal, boxMaxLocal;
					castShape->getAabb(rotationXform, boxMinLocal, boxMaxLocal);

					cbtVector3 rayAabbMinLocal = convexFromLocal;
					rayAabbMinLocal.setMin(convexToLocal);
					cbtVector3 rayAabbMaxLocal = convexFromLocal;
					rayAabbMaxLocal.setMax(convexToLocal);
					rayAabbMinLocal += boxMinLocal;
					rayAabbMaxLocal += boxMaxLocal;
					concaveShape->processAllTriangles(&tccb, rayAabbMinLocal, rayAabbMaxLocal);
				}
			}
		}
		else
		{
			if (collisionShape->isCompound())
			{
				struct cbtCompoundLeafCallback : cbtDbvt::ICollide
				{
					cbtCompoundLeafCallback(
						const cbtCollisionObjectWrapper* colObjWrap,
						const cbtConvexShape* castShape,
						const cbtTransform& convexFromTrans,
						const cbtTransform& convexToTrans,
						cbtScalar allowedPenetration,
						const cbtCompoundShape* compoundShape,
						const cbtTransform& colObjWorldTransform,
						ConvexResultCallback& resultCallback)
						: m_colObjWrap(colObjWrap),
						  m_castShape(castShape),
						  m_convexFromTrans(convexFromTrans),
						  m_convexToTrans(convexToTrans),
						  m_allowedPenetration(allowedPenetration),
						  m_compoundShape(compoundShape),
						  m_colObjWorldTransform(colObjWorldTransform),
						  m_resultCallback(resultCallback)
					{
					}

					const cbtCollisionObjectWrapper* m_colObjWrap;
					const cbtConvexShape* m_castShape;
					const cbtTransform& m_convexFromTrans;
					const cbtTransform& m_convexToTrans;
					cbtScalar m_allowedPenetration;
					const cbtCompoundShape* m_compoundShape;
					const cbtTransform& m_colObjWorldTransform;
					ConvexResultCallback& m_resultCallback;

				public:
					void ProcessChild(int index, const cbtTransform& childTrans, const cbtCollisionShape* childCollisionShape)
					{
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						struct LocalInfoAdder : public ConvexResultCallback
						{
							ConvexResultCallback* m_userCallback;
							int m_i;

							LocalInfoAdder(int i, ConvexResultCallback* user)
								: m_userCallback(user), m_i(i)
							{
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
							}
							virtual bool needsCollision(cbtBroadphaseProxy* p) const
							{
								return m_userCallback->needsCollision(p);
							}
							virtual cbtScalar addSingleResult(cbtCollisionWorld::LocalConvexResult& r, bool b)
							{
								cbtCollisionWorld::LocalShapeInfo shapeInfo;
								shapeInfo.m_shapePart = -1;
								shapeInfo.m_triangleIndex = m_i;
								if (r.m_localShapeInfo == NULL)
									r.m_localShapeInfo = &shapeInfo;
								const cbtScalar result = m_userCallback->addSingleResult(r, b);
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
								return result;
							}
						};

						LocalInfoAdder my_cb(index, &m_resultCallback);

						cbtCollisionObjectWrapper tmpObj(m_colObjWrap, childCollisionShape, m_colObjWrap->getCollisionObject(), childWorldTrans, -1, index);

						objectQuerySingleInternal(m_castShape, m_convexFromTrans, m_convexToTrans, &tmpObj, my_cb, m_allowedPenetration);
					}

					void Process(const cbtDbvtNode* leaf)
					{
						// Processing leaf node
						int index = leaf->dataAsInt;

						cbtTransform childTrans = m_compoundShape->getChildTransform(index);
						const cbtCollisionShape* childCollisionShape = m_compoundShape->getChildShape(index);

						ProcessChild(index, childTrans, childCollisionShape);
					}
				};

				BT_PROFILE("convexSweepCompound");
				const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(collisionShape);

				cbtVector3 fromLocalAabbMin, fromLocalAabbMax;
				cbtVector3 toLocalAabbMin, toLocalAabbMax;

				castShape->getAabb(colObjWorldTransform.inverse() * convexFromTrans, fromLocalAabbMin, fromLocalAabbMax);
				castShape->getAabb(colObjWorldTransform.inverse() * convexToTrans, toLocalAabbMin, toLocalAabbMax);

				fromLocalAabbMin.setMin(toLocalAabbMin);
				fromLocalAabbMax.setMax(toLocalAabbMax);

				cbtCompoundLeafCallback callback(colObjWrap, castShape, convexFromTrans, convexToTrans,
												allowedPenetration, compoundShape, colObjWorldTransform, resultCallback);

				const cbtDbvt* tree = compoundShape->getDynamicAabbTree();
				if (tree)
				{
					const ATTRIBUTE_ALIGNED16(cbtDbvtVolume) bounds = cbtDbvtVolume::FromMM(fromLocalAabbMin, fromLocalAabbMax);
					tree->collideTV(tree->m_root, bounds, callback);
				}
				else
				{
					int i;
					for (i = 0; i < compoundShape->getNumChildShapes(); i++)
					{
						const cbtCollisionShape* childCollisionShape = compoundShape->getChildShape(i);
						cbtTransform childTrans = compoundShape->getChildTransform(i);
						callback.ProcessChild(i, childTrans, childCollisionShape);
					}
				}
			}
		}
	}
}